

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeVirtualMemGetAccessAttribute
          (ze_context_handle_t hContext,void *ptr,size_t size,ze_memory_access_attribute_t *access,
          size_t *outSize)

{
  ze_pfnVirtualMemGetAccessAttribute_t pfnGetAccessAttribute;
  ze_result_t result;
  size_t *outSize_local;
  ze_memory_access_attribute_t *access_local;
  size_t size_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnGetAccessAttribute._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c750 != (code *)0x0) {
    pfnGetAccessAttribute._4_4_ = (*DAT_0011c750)(hContext,ptr,size,access,outSize);
  }
  return pfnGetAccessAttribute._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemGetAccessAttribute(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of virtual address region for query.
        size_t size,                                    ///< [in] size in bytes; must be page aligned.
        ze_memory_access_attribute_t* access,           ///< [out] query result for page access attribute.
        size_t* outSize                                 ///< [out] query result for size of virtual address range, starting at ptr,
                                                        ///< that shares same access attribute.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetAccessAttribute = context.zeDdiTable.VirtualMem.pfnGetAccessAttribute;
        if( nullptr != pfnGetAccessAttribute )
        {
            result = pfnGetAccessAttribute( hContext, ptr, size, access, outSize );
        }
        else
        {
            // generic implementation
        }

        return result;
    }